

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int64 __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  int in_ESI;
  CodedInputStream *in_RDI;
  pair<bool,_const_unsigned_char_*> pVar5;
  uint32 temp_1;
  pair<bool,_const_unsigned_char_*> p;
  uint32 temp;
  int i;
  uint32 result;
  uint32 b;
  uint8 *ptr;
  uchar **in_stack_ffffffffffffff08;
  bool *in_stack_ffffffffffffff10;
  uint32 *in_stack_ffffffffffffff28;
  uint local_c4;
  uint local_ac [22];
  int local_54;
  ulong local_48;
  undefined1 local_3e;
  undefined1 local_3d;
  int local_3c;
  uint local_38;
  uint local_34;
  byte *local_30;
  uint *local_28;
  uint8 *local_20;
  int local_14;
  byte local_10;
  uchar *local_8;
  
  local_54 = in_ESI;
  iVar3 = BufferSize(in_RDI);
  if ((iVar3 < 10) &&
     ((in_RDI->buffer_end_ <= in_RDI->buffer_ || ((in_RDI->buffer_end_[-1] & 0x80) != 0)))) {
    bVar2 = ReadVarint32Slow(in_RDI,in_stack_ffffffffffffff28);
    if (!bVar2) {
      return -1;
    }
    return (ulong)local_c4;
  }
  local_20 = in_RDI->buffer_;
  local_14 = local_54;
  local_28 = local_ac;
  local_30 = local_20 + 2;
  local_34 = (uint)local_20[1];
  local_38 = local_34 * 0x80 + local_54 + -0x80;
  if ((local_20[1] & 0x80) != 0) {
    bVar1 = *local_30;
    local_34 = (uint)bVar1;
    local_38 = local_34 * 0x4000 + (local_38 - 0x4000);
    local_30 = local_20 + 3;
    if ((bVar1 & 0x80) != 0) {
      bVar1 = local_20[3];
      local_34 = (uint)bVar1;
      local_38 = local_34 * 0x200000 + (local_38 - 0x200000);
      local_30 = local_20 + 4;
      if ((bVar1 & 0x80) != 0) {
        bVar1 = local_20[4];
        local_34 = (uint)bVar1;
        local_38 = local_34 * 0x10000000 + local_38 + 0xf0000000;
        local_30 = local_20 + 5;
        if ((bVar1 & 0x80) != 0) {
          for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
            pbVar4 = local_30 + 1;
            bVar1 = *local_30;
            local_34 = (uint)bVar1;
            local_30 = pbVar4;
            if ((bVar1 & 0x80) == 0) goto LAB_003c5b21;
          }
          local_3d = 0;
          pVar5 = std::make_pair<bool,unsigned_char_const*&>
                            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          local_8 = pVar5.second;
          local_10 = pVar5.first;
          goto LAB_003c5b5e;
        }
      }
    }
  }
LAB_003c5b21:
  local_ac[0] = local_38;
  local_3e = 1;
  pVar5 = std::make_pair<bool,unsigned_char_const*&>
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_8 = pVar5.second;
  local_10 = pVar5.first;
LAB_003c5b5e:
  if ((local_10 & 1) == 0) {
    local_48 = 0xffffffffffffffff;
  }
  else {
    in_RDI->buffer_ = local_8;
    local_48 = (ulong)local_ac[0];
  }
  return local_48;
}

Assistant:

int64 CodedInputStream::ReadVarint32Fallback(uint32 first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32 temp;
    ::std::pair<bool, const uint8*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32 temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64>(temp) : -1;
  }
}